

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O0

TString * luaS_newlstr(lua_State *L,char *str,size_t l)

{
  TString *ts;
  size_t l_local;
  char *str_local;
  lua_State *L_local;
  
  if (l < 0x29) {
    L_local = (lua_State *)internshrstr(L,str,l);
  }
  else {
    if (0x7fffffffffffffe6 < l) {
      luaM_toobig(L);
    }
    L_local = (lua_State *)luaS_createlngstrobj(L,l);
    memcpy(&L_local->l_G,str,l);
  }
  return (TString *)L_local;
}

Assistant:

TString *luaS_newlstr (lua_State *L, const char *str, size_t l) {
  if (l <= LUAI_MAXSHORTLEN)  /* short string? */
    return internshrstr(L, str, l);
  else {
    TString *ts;
    if (l >= (MAX_SIZE - sizeof(TString))/sizeof(char))
      luaM_toobig(L);
    ts = luaS_createlngstrobj(L, l);
    memcpy(getstr(ts), str, l * sizeof(char));
    return ts;
  }
}